

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O0

void __thiscall
aggreports::aggreports
          (aggreports *this,int totalperiods,FILE **fout,bool useReturnPeriodFile,bool *outputFlags,
          bool ordFlag,string *parquetFileNames,char *progname)

{
  initializer_list<std::pair<const_int,_bool>_> __l;
  initializer_list<std::pair<const_int,_bool>_> __l_00;
  allocator<std::pair<const_int,_bool>_> local_da;
  less<int> local_d9;
  pair<const_int,_bool> local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  iterator local_90;
  size_type local_88;
  allocator<std::pair<const_int,_bool>_> local_6a;
  less<int> local_69;
  pair<const_int,_bool> local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  iterator local_48;
  size_type local_40;
  byte local_31;
  bool *pbStack_30;
  bool ordFlag_local;
  bool *outputFlags_local;
  FILE **ppFStack_20;
  bool useReturnPeriodFile_local;
  FILE **fout_local;
  aggreports *paStack_10;
  int totalperiods_local;
  aggreports *this_local;
  
  this->totalperiods_ = totalperiods;
  local_31 = ordFlag;
  pbStack_30 = outputFlags;
  outputFlags_local._7_1_ = useReturnPeriodFile;
  ppFStack_20 = fout;
  fout_local._4_4_ = totalperiods;
  paStack_10 = this;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(&this->summaryids_);
  this->fout_ = ppFStack_20;
  this->useReturnPeriodFile_ = (bool)(outputFlags_local._7_1_ & 1);
  this->outputFlags_ = pbStack_30;
  this->ordFlag_ = (bool)(local_31 & 1);
  this->parquetFileNames_ = parquetFileNames;
  this->progname_ = progname;
  this->eptHeader_ = true;
  this->pseptHeader_ = true;
  local_68.first = 0;
  local_68.second = true;
  local_68._5_3_ = 0;
  uStack_60 = 1;
  local_58 = 3;
  local_48 = &local_68;
  local_40 = 3;
  std::allocator<std::pair<const_int,_bool>_>::allocator(&local_6a);
  __l_00._M_len = local_40;
  __l_00._M_array = local_48;
  std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::map
            (&this->wheatSheaf_,__l_00,&local_69,&local_6a);
  std::allocator<std::pair<const_int,_bool>_>::~allocator(&local_6a);
  std::vector<int,_std::allocator<int>_>::vector(&this->returnperiods_);
  std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::map
            (&this->periodstoweighting_);
  std::
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::map(&this->ensembletosidx_);
  local_a8 = 6;
  uStack_a0 = 7;
  local_b8 = 4;
  uStack_b0 = 5;
  local_c8 = 2;
  uStack_c0 = 3;
  local_d8.first = 0;
  local_d8.second = false;
  local_d8._5_3_ = 0;
  uStack_d0 = 1;
  local_90 = &local_d8;
  local_88 = 8;
  std::allocator<std::pair<const_int,_bool>_>::allocator(&local_da);
  __l._M_len = local_88;
  __l._M_array = local_90;
  std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::map
            (&this->fileHeaders_,__l,&local_d9,&local_da);
  std::allocator<std::pair<const_int,_bool>_>::~allocator(&local_da);
  *(undefined8 *)&this->field_0x158 = 0;
  this->WriteEPTOutput = 0;
  *(undefined8 *)&this->field_0x168 = 0;
  this->WritePSEPTOutput = 0;
  this->GetAgg = (offset_in_OutLosses_to_subr)OutLosses::GetAggOutLoss;
  *(undefined8 *)&this->field_0x178 = 0;
  this->GetMax = (offset_in_OutLosses_to_subr)OutLosses::GetMaxOutLoss;
  *(undefined8 *)&this->field_0x188 = 0;
  LoadReturnPeriods(this);
  LoadPeriodsToWeighting(this);
  return;
}

Assistant:

aggreports::aggreports(const int totalperiods, FILE **fout,
		       const bool useReturnPeriodFile, bool *outputFlags,
		       const bool ordFlag, const std::string *parquetFileNames,
		       const char *progname) :
	totalperiods_(totalperiods), fout_(fout),
	useReturnPeriodFile_(useReturnPeriodFile), outputFlags_(outputFlags),
	ordFlag_(ordFlag), parquetFileNames_(parquetFileNames),
	progname_(progname)
{

  LoadReturnPeriods();
  LoadPeriodsToWeighting();

}